

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionModelBullet.cpp
# Opt level: O1

bool __thiscall
chrono::collision::ChCollisionModelBullet::AddConvexHull
          (ChCollisionModelBullet *this,shared_ptr<chrono::ChMaterialSurface> *material,
          vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *pointlist,
          ChVector<double> *pos,ChMatrix33<double> *rot)

{
  pointer pCVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ChMatrix33<double> *rot_00;
  double *pdVar5;
  ChCollisionShapeBullet *this_00;
  cbtConvexHullShape *this_01;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  ChConvexHullLibraryWrapper lh;
  ChTriangleMeshConnected mmesh;
  ChConvexHullLibraryWrapper local_161;
  ChMatrix33<double> *local_160;
  shared_ptr<chrono::ChMaterialSurface> local_158;
  cbtVector3 local_148;
  ChVector<double> *local_138;
  undefined1 local_130 [16];
  pointer pCStack_120;
  undefined1 local_e8 [64];
  undefined1 local_a8 [24];
  undefined1 auStack_90 [40];
  _Vector_impl_data _Stack_68;
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  pCVar1 = (pointlist->
           super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>)
           ._M_impl.super__Vector_impl_data._M_start;
  lVar6 = (long)(pointlist->
                super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar1;
  if (lVar6 == 0) {
    auVar13 = ZEXT816(0xc1ddcd6500000000);
    auVar10 = auVar13;
    auVar12 = auVar13;
  }
  else {
    lVar6 = (lVar6 >> 3) * -0x5555555555555555;
    lVar6 = lVar6 + (ulong)(lVar6 == 0);
    pdVar5 = pCVar1->m_data + 2;
    auVar12 = ZEXT816(0x41cdcd6500000000);
    auVar11 = ZEXT816(0xc1cdcd6500000000);
    auVar2 = auVar11;
    auVar10 = auVar11;
    auVar3 = auVar12;
    auVar4 = auVar12;
    do {
      auVar14._8_8_ = 0;
      auVar14._0_8_ = ((ChVector<double> *)(pdVar5 + -2))->m_data[0];
      auVar15._8_8_ = 0;
      auVar15._0_8_ = pdVar5[-1];
      auVar10 = vmaxsd_avx(auVar10,auVar14);
      auVar2 = vmaxsd_avx(auVar2,auVar15);
      auVar16._8_8_ = 0;
      auVar16._0_8_ = *pdVar5;
      auVar11 = vmaxsd_avx(auVar11,auVar16);
      auVar12 = vminsd_avx(auVar12,auVar14);
      auVar3 = vminsd_avx(auVar3,auVar15);
      auVar4 = vminsd_avx(auVar4,auVar16);
      pdVar5 = pdVar5 + 3;
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
    auVar13._8_8_ = 0;
    auVar13._0_8_ = auVar10._0_8_ - auVar12._0_8_;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = auVar2._0_8_ - auVar3._0_8_;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = auVar11._0_8_ - auVar4._0_8_;
  }
  auVar12 = vminsd_avx(auVar13,auVar12);
  auVar10 = vminsd_avx(auVar12,auVar10);
  local_160 = auVar10._0_8_;
  local_138 = pos;
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x23])(this);
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x22])(this);
  bt_utils::ChConvexHullLibraryWrapper::ChConvexHullLibraryWrapper(&local_161);
  local_50._M_p = (pointer)&local_40;
  local_130._0_8_ = &PTR__ChTriangleMeshConnected_00b669b8;
  auVar10 = ZEXT816(0) << 0x40;
  register0x00001200 = ZEXT1664(auVar10);
  local_a8._16_8_ = 0;
  local_a8._0_16_ = auVar10;
  auStack_90 = ZEXT1640(auVar10);
  _Stack_68._M_start = (pointer)0x0;
  _Stack_68._M_finish = (pointer)0x0;
  _Stack_68._M_end_of_storage = (pointer)0x0;
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_e8 = register0x00001200;
  bt_utils::ChConvexHullLibraryWrapper::ComputeHull
            (&local_161,pointlist,(ChTriangleMeshConnected *)local_130);
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x23])(this);
  auVar2._8_4_ = 0x80000000;
  auVar2._0_8_ = 0x8000000080000000;
  auVar2._12_4_ = 0x80000000;
  auVar10 = vxorps_avx512vl(auVar10,auVar2);
  geometry::ChTriangleMeshConnected::MakeOffset
            ((ChTriangleMeshConnected *)local_130,(double)auVar10._0_4_);
  this_00 = (ChCollisionShapeBullet *)::operator_new(0x28);
  local_158.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_158.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
          _M_refcount._M_pi;
  if (local_158.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_158.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_158.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_158.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_158.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  ChCollisionShapeBullet::ChCollisionShapeBullet(this_00,CONVEXHULL,&local_158);
  if (local_158.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_158.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  this_01 = (cbtConvexHullShape *)cbtAlignedAllocInternal(0x98,0x10);
  local_160 = rot;
  cbtConvexHullShape::cbtConvexHullShape(this_01,(cbtScalar *)0x0,0,0x10);
  if (pCStack_120 != (pointer)local_130._8_8_) {
    uVar7 = 0;
    uVar8 = 1;
    do {
      local_148.m_floats[0] = (cbtScalar)((pointer)(local_130._8_8_ + uVar7 * 0x18))->m_data[0];
      local_148.m_floats[1] = (cbtScalar)((pointer)(local_130._8_8_ + uVar7 * 0x18))->m_data[1];
      local_148.m_floats[2] = (cbtScalar)((pointer)(local_130._8_8_ + uVar7 * 0x18))->m_data[2];
      local_148.m_floats[3] = 0.0;
      cbtConvexHullShape::addPoint(this_01,&local_148,true);
      uVar7 = ((long)pCStack_120 - local_130._8_8_ >> 3) * -0x5555555555555555;
      bVar9 = uVar8 <= uVar7;
      lVar6 = uVar7 - uVar8;
      uVar7 = uVar8;
      uVar8 = (ulong)((int)uVar8 + 1);
    } while (bVar9 && lVar6 != 0);
  }
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x2b])(this);
  rot_00 = local_160;
  (*(this_01->super_cbtPolyhedralConvexAabbCachingShape).super_cbtPolyhedralConvexShape.
    super_cbtConvexInternalShape.super_cbtConvexShape.super_cbtCollisionShape.
    _vptr_cbtCollisionShape[0xb])(this_01);
  cbtPolyhedralConvexAabbCachingShape::recalcLocalAabb
            ((cbtPolyhedralConvexAabbCachingShape *)this_01);
  this_00->m_bt_shape = (cbtCollisionShape *)this_01;
  injectShape(this,local_138,rot_00,this_00);
  geometry::ChTriangleMeshConnected::~ChTriangleMeshConnected((ChTriangleMeshConnected *)local_130);
  return true;
}

Assistant:

bool ChCollisionModelBullet::AddConvexHull(std::shared_ptr<ChMaterialSurface> material,
                                           const std::vector<ChVector<double>>& pointlist,
                                           const ChVector<>& pos,
                                           const ChMatrix33<>& rot) {
    // adjust default inward margin (if object too thin)
    ChVector<> aabbMax(-1e9, -1e9, -1e9);
    ChVector<> aabbMin(1e9, 1e9, 1e9);
    for (size_t i = 0; i < pointlist.size(); ++i) {
        aabbMax.x() = ChMax(aabbMax.x(), pointlist[i].x());
        aabbMax.y() = ChMax(aabbMax.y(), pointlist[i].y());
        aabbMax.z() = ChMax(aabbMax.z(), pointlist[i].z());
        aabbMin.x() = ChMin(aabbMin.x(), pointlist[i].x());
        aabbMin.y() = ChMin(aabbMin.y(), pointlist[i].y());
        aabbMin.z() = ChMin(aabbMin.z(), pointlist[i].z());
    }
    ChVector<> aabbsize = aabbMax - aabbMin;
    double approx_chord = ChMin(ChMin(aabbsize.x(), aabbsize.y()), aabbsize.z());
    // override the inward margin if larger than 0.2 chord:
    SetSafeMargin((cbtScalar)ChMin(GetSafeMargin(), approx_chord * 0.2));

    // shrink the convex hull by GetSafeMargin()
    bt_utils::ChConvexHullLibraryWrapper lh;
    geometry::ChTriangleMeshConnected mmesh;
    lh.ComputeHull(pointlist, mmesh);
    mmesh.MakeOffset(-GetSafeMargin());

    auto shape = new ChCollisionShapeBullet(ChCollisionShape::Type::CONVEXHULL, material);

    auto bt_shape = new cbtConvexHullShape;
    for (unsigned int i = 0; i < mmesh.m_vertices.size(); i++) {
        bt_shape->addPoint(cbtVector3((cbtScalar)mmesh.m_vertices[i].x(), (cbtScalar)mmesh.m_vertices[i].y(),
                                      (cbtScalar)mmesh.m_vertices[i].z()));
    }
    bt_shape->setMargin((cbtScalar)GetSuggestedFullMargin());
    bt_shape->recalcLocalAabb();
    shape->m_bt_shape = bt_shape;

    injectShape(pos, rot, shape);
    return true;
}